

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O2

void __thiscall
icu_63::MessagePattern::MessagePattern
          (MessagePattern *this,UMessagePatternApostropheMode mode,UErrorCode *errorCode)

{
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__MessagePattern_003cdb18;
  this->aposMode = mode;
  (this->msg).super_Replaceable.super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003d8fe8;
  (this->msg).fUnion.fStackFields.fLengthAndFlags = 2;
  this->partsList = (MessagePatternPartsList *)0x0;
  this->parts = (Part *)0x0;
  this->partsLength = 0;
  this->numericValuesList = (MessagePatternDoubleList *)0x0;
  this->numericValues = (double *)0x0;
  *(undefined8 *)((long)&this->numericValues + 7) = 0;
  init(this,(EVP_PKEY_CTX *)errorCode);
  return;
}

Assistant:

MessagePattern::MessagePattern(UMessagePatternApostropheMode mode, UErrorCode &errorCode)
        : aposMode(mode),
          partsList(NULL), parts(NULL), partsLength(0),
          numericValuesList(NULL), numericValues(NULL), numericValuesLength(0),
          hasArgNames(FALSE), hasArgNumbers(FALSE), needsAutoQuoting(FALSE) {
    init(errorCode);
}